

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O0

void __thiscall aiLight::aiLight(aiLight *this)

{
  aiLight *this_local;
  
  aiString::aiString(&this->mName);
  this->mType = aiLightSource_UNDEFINED;
  aiVector3t<float>::aiVector3t(&this->mPosition);
  aiVector3t<float>::aiVector3t(&this->mDirection);
  aiVector3t<float>::aiVector3t(&this->mUp);
  this->mAttenuationConstant = 0.0;
  this->mAttenuationLinear = 1.0;
  this->mAttenuationQuadratic = 0.0;
  aiColor3D::aiColor3D(&this->mColorDiffuse);
  aiColor3D::aiColor3D(&this->mColorSpecular);
  aiColor3D::aiColor3D(&this->mColorAmbient);
  this->mAngleInnerCone = 6.2831855;
  this->mAngleOuterCone = 6.2831855;
  aiVector2t<float>::aiVector2t(&this->mSize,0.0,0.0);
  return;
}

Assistant:

aiLight() AI_NO_EXCEPT
        :   mType                 (aiLightSource_UNDEFINED)
        ,   mAttenuationConstant  (0.f)
        ,   mAttenuationLinear    (1.f)
        ,   mAttenuationQuadratic (0.f)
        ,   mAngleInnerCone       ((float)AI_MATH_TWO_PI)
        ,   mAngleOuterCone       ((float)AI_MATH_TWO_PI)
        ,   mSize                 (0.f, 0.f)
    {
    }